

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O2

void duckdb::SQLLogicTestLogger::PrintErrorHeader
               (string *file_name,idx_t query_line,string *description)

{
  ostream *poVar1;
  ostream *poVar2;
  
  PrintLineSep();
  poVar1 = termcolor::red((ostream *)&std::cerr);
  poVar1 = termcolor::bold(poVar1);
  poVar2 = std::operator<<((ostream *)poVar1,(string *)description);
  poVar2 = std::operator<<(poVar2," ");
  termcolor::reset((ostream *)poVar2);
  if (file_name->_M_string_length != 0) {
    poVar1 = termcolor::bold((ostream *)&std::cerr);
    poVar2 = std::operator<<((ostream *)poVar1,"(");
    poVar2 = std::operator<<(poVar2,(string *)file_name);
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,")!");
    termcolor::reset((ostream *)poVar2);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  return;
}

Assistant:

void SQLLogicTestLogger::PrintErrorHeader(const string &file_name, idx_t query_line, const string &description) {
	PrintLineSep();
	std::cerr << termcolor::red << termcolor::bold << description << " " << termcolor::reset;
	if (!file_name.empty()) {
		std::cerr << termcolor::bold << "(" << file_name << ":" << query_line << ")!" << termcolor::reset;
	}
	std::cerr << std::endl;
}